

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void discardBlockComment(void)

{
  LexerState *pLVar1;
  int iVar2;
  
  pLVar1 = lexerState;
  pLVar1->disableMacroArgs = true;
  pLVar1->disableInterpolation = true;
LAB_0010d5e5:
  do {
    while( true ) {
      iVar2 = nextChar();
      if (iVar2 != 10) break;
LAB_0010d60c:
      pLVar1 = lexerState;
      if (lexerState->expansions == (Expansion *)0x0) {
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar1->colNo = 1;
      }
    }
    if (iVar2 == 0xd) {
      handleCRLF(0xd);
      goto LAB_0010d60c;
    }
    if (iVar2 != 0x2a) {
      if (iVar2 == 0x2f) {
        iVar2 = peek();
        if (iVar2 == 0x2a) {
          warning(WARNING_NESTED_COMMENT,"/* in block comment\n");
        }
      }
      else if (iVar2 == -1) {
        error("Unterminated block comment\n");
        goto LAB_0010d660;
      }
      goto LAB_0010d5e5;
    }
    iVar2 = peek();
    if (iVar2 == 0x2f) {
      shiftChar();
LAB_0010d660:
      pLVar1 = lexerState;
      pLVar1->disableMacroArgs = false;
      pLVar1->disableInterpolation = false;
      return;
    }
  } while( true );
}

Assistant:

static void discardBlockComment(void)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;
	for (;;) {
		int c = nextChar();

		switch (c) {
		case EOF:
			error("Unterminated block comment\n");
			goto finish;
		case '\r':
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			// fallthrough
		case '\n':
			if (!lexerState->expansions)
				nextLine();
			continue;
		case '/':
			if (peek() == '*') {
				warning(WARNING_NESTED_COMMENT,
					"/* in block comment\n");
			}
			continue;
		case '*':
			if (peek() == '/') {
				shiftChar();
				goto finish;
			}
			// fallthrough
		default:
			continue;
		}
	}
finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}